

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

void shim_vkGetPhysicalDeviceFeatures2KHR
               (VkPhysicalDevice physicalDevice,VkPhysicalDeviceFeatures2 *pFeatures)

{
  pointer pvVar1;
  bool bVar2;
  PhysicalDeviceDetails *pPVar3;
  char *pcVar4;
  size_type __n;
  VkBaseOutStructure *next;
  VkBaseOutStructure structure_data;
  vector<char,_std::allocator<char>_> *features_pNext;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *__range2;
  VkBaseOutStructure *current;
  PhysicalDeviceDetails *phys_dev;
  VkPhysicalDeviceFeatures2 *pFeatures_local;
  VkPhysicalDevice physicalDevice_local;
  
  pPVar3 = get_physical_device_details(physicalDevice);
  memcpy(&pFeatures->features,&pPVar3->features,0xdc);
  pPVar3 = get_physical_device_details(physicalDevice);
  __range2 = (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              *)pFeatures->pNext;
  do {
    if (__range2 ==
        (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
         *)0x0) {
      return;
    }
    __end2 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::begin(&pPVar3->features_pNextChain);
    features_pNext =
         (vector<char,_std::allocator<char>_> *)
         std::
         vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
         ::end(&pPVar3->features_pNextChain);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
                                       *)&features_pNext), bVar2) {
      structure_data.pNext =
           (VkBaseOutStructure *)
           __gnu_cxx::
           __normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      memset(&next,0,0x10);
      pcVar4 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)structure_data.pNext);
      next = *(VkBaseOutStructure **)pcVar4;
      structure_data._0_8_ = *(undefined8 *)(pcVar4 + 8);
      if ((int)next ==
          *(int *)&(__range2->
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) {
        pvVar1 = (__range2->
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pcVar4 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)structure_data.pNext);
        __n = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)structure_data.pNext);
        memcpy(__range2,pcVar4,__n);
        (__range2->
        super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pvVar1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __range2 = (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                *)(__range2->
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

VKAPI_ATTR void VKAPI_CALL shim_vkGetPhysicalDeviceFeatures2KHR(VkPhysicalDevice physicalDevice, VkPhysicalDeviceFeatures2* pFeatures) {
    pFeatures->features = get_physical_device_details(physicalDevice).features;
    const auto& phys_dev = get_physical_device_details(physicalDevice);
    VkBaseOutStructure* current = static_cast<VkBaseOutStructure*>(pFeatures->pNext);
    while (current) {
        for (const auto& features_pNext : phys_dev.features_pNextChain) {
            VkBaseOutStructure structure_data{};
            memcpy(&structure_data, features_pNext.data(), sizeof(structure_data));
            if (structure_data.sType == current->sType) {
                VkBaseOutStructure* next = static_cast<VkBaseOutStructure*>(current->pNext);
                std::memcpy(static_cast<void*>(current), features_pNext.data(), features_pNext.size());
                // Repair pNext void* since we clobbered it in the memcpy
                current->pNext = next;
                break;
            }
        }
        current = static_cast<VkBaseOutStructure*>(current->pNext);
    }
}